

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_reader.cc
# Opt level: O0

bool __thiscall FileReader::nextPacket(FileReader *this,array<unsigned_char,_892UL> *out)

{
  ulong uVar1;
  size_type sVar2;
  ostream *poVar3;
  reference pvVar4;
  runtime_error *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  pointer pvVar5;
  array<unsigned_char,_892UL> *in_RSI;
  long in_RDI;
  stringstream ss;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffdc8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffdd0;
  const_iterator in_stack_fffffffffffffde8;
  string local_1d0 [48];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  array<unsigned_char,_892UL> *local_18;
  
  local_18 = in_RSI;
  do {
    uVar1 = std::ios::good();
    if (((uVar1 & 1) == 0) || (uVar1 = std::ios::eof(), (uVar1 & 1) != 0)) {
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(in_RDI + 8));
      if (sVar2 == 0) {
        return false;
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"Reading: ");
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::front(in_stack_fffffffffffffdd0);
      poVar3 = std::operator<<(poVar3,(string *)pvVar4);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::ifstream::close();
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::front(in_stack_fffffffffffffdd0);
      std::ifstream::open((string *)(in_RDI + 0x20),(_Ios_Openmode)pvVar4);
      uVar1 = std::ios::good();
      if ((uVar1 & 1) == 0) {
        std::__cxx11::stringstream::stringstream(local_1a0);
        poVar3 = std::operator<<(local_190,"Unable to open ");
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::front(in_stack_fffffffffffffdd0);
        std::operator<<(poVar3,(string *)pvVar4);
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringstream::str();
        std::runtime_error::runtime_error(this_00,local_1d0);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      this_01 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(in_RDI + 8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::begin(in_stack_fffffffffffffdc8);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffdd0,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffdc8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase(this_01,in_stack_fffffffffffffde8);
    }
    in_stack_fffffffffffffdd0 =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)(in_RDI + 0x20);
    pvVar5 = std::array<unsigned_char,_892UL>::data((array<unsigned_char,_892UL> *)0x2e1191);
    std::array<unsigned_char,_892UL>::size(local_18);
    std::istream::read((char *)in_stack_fffffffffffffdd0,(long)pvVar5);
    uVar1 = std::ios::eof();
    if ((uVar1 & 1) == 0) {
      return true;
    }
  } while( true );
}

Assistant:

bool FileReader::nextPacket(std::array<uint8_t, 892>& out) {
  for (;;) {
    // Make sure the ifstream is OK
    if (!ifs_.good() || ifs_.eof()) {
      if (files_.size() == 0) {
        return false;
      }

      // Open next file
      std::cout << "Reading: " << files_.front() << std::endl;
      ifs_.close();
      ifs_.open(files_.front());
      if (!ifs_.good()) {
        std::stringstream ss;
        ss << "Unable to open " << files_.front();
        throw std::runtime_error(ss.str());
      }
      files_.erase(files_.begin());
    }

    ifs_.read((char*) out.data(), out.size());
    if (ifs_.eof()) {
      continue;
    }

    return true;
  }
}